

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

size_t mi_bin(size_t size)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = size + 7;
  if (uVar3 < 0x48) {
    sVar1 = 1;
    if (0xf < uVar3) {
      sVar1 = (ulong)((int)(uVar3 >> 3) + 1U & 0x1e);
    }
    return sVar1;
  }
  if (uVar3 < 0x10008) {
    uVar2 = (uVar3 >> 3) - 1;
    uVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    return ((ulong)((uint)(uVar2 >> (0x3dU - (char)(uVar3 ^ 0x3f) & 0x3f)) & 3) +
            ((uVar3 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
  }
  return 0x49;
}

Assistant:

static inline size_t _mi_wsize_from_size(size_t size) {
  mi_assert_internal(size <= SIZE_MAX - sizeof(uintptr_t));
  return (size + sizeof(uintptr_t) - 1) / sizeof(uintptr_t);
}